

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall
chrono::ChParticleCloud::ChParticleCloud(ChParticleCloud *this,ChParticleCloud *other)

{
  ChSharedMassBody *this_00;
  ChMatrix33<double> *dst;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  float fVar5;
  float fVar6;
  float fVar7;
  SrcXprType SVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  ActualDstType actualDst;
  assign_op<double,_double> local_39;
  SrcXprType local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  ChPhysicsItem::ChPhysicsItem((ChPhysicsItem *)this,(ChPhysicsItem *)other);
  this_00 = &this->particle_mass;
  (this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChParticleCloud_00b0e458;
  (this->particles).
  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->particles).
  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->particles).
  super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ChSharedMassBody::ChSharedMassBody(this_00);
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->do_collide = other->do_collide;
  this->do_limit_speed = other->do_limit_speed;
  dVar1 = (other->particle_mass).mass;
  if (0.0 < dVar1) {
    ChSharedMassBody::SetBodyMass(this_00,dVar1);
  }
  dVar1 = (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar2 = (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  dst = &(this->particle_mass).inv_inertia;
  (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar1;
  (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar2;
  local_38.m_xpr = (XprTypeNested)this_00;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&dst->super_Matrix<double,_3,_3,_1,_3,_3>,&local_38,&local_39);
  dVar1 = (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar4 = *(undefined1 (*) [16])
            ((other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1
            );
  dVar2 = (other->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  *(undefined1 (*) [16])
   ((this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       auVar4;
  (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar1;
  dVar3 = (double)vmovlpd_avx(auVar4);
  (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar3;
  (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar2;
  (this->particle_mass).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar1;
  local_38.m_xpr = (XprTypeNested)this_00;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&dst->super_Matrix<double,_3,_3,_1,_3,_3>,&local_38,&local_39);
  (*this->particle_collision_model->_vptr_ChCollisionModel[3])();
  iVar10 = (*((other->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ChMaterialSurface[2])();
  local_38.m_xpr = (XprTypeNested)CONCAT44(extraout_var,iVar10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChMaterialSurface*>
            (a_Stack_30,(ChMaterialSurface *)local_38.m_xpr);
  _Var9._M_pi = a_Stack_30[0]._M_pi;
  SVar8.m_xpr = local_38.m_xpr;
  local_38.m_xpr = (XprTypeNested)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (this->matsurface).
            super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SVar8.m_xpr;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  uVar11 = (*(other->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])
                     (other);
  (*(this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3e])
            (this,(ulong)uVar11);
  this->sleep_starttime = other->sleep_starttime;
  fVar5 = other->max_wvel;
  fVar6 = other->sleep_time;
  fVar7 = other->sleep_minspeed;
  this->max_speed = other->max_speed;
  this->max_wvel = fVar5;
  this->sleep_time = fVar6;
  this->sleep_minspeed = fVar7;
  this->sleep_minwvel = other->sleep_minwvel;
  return;
}

Assistant:

ChParticleCloud::ChParticleCloud(const ChParticleCloud& other) : ChIndexedParticles(other) {
    do_collide = other.do_collide;
    do_limit_speed = other.do_limit_speed;

    SetMass(other.GetMass());
    SetInertiaXX(other.GetInertiaXX());
    SetInertiaXY(other.GetInertiaXY());

    particle_collision_model->ClearModel();

    matsurface = std::shared_ptr<ChMaterialSurface>(other.matsurface->Clone());  // deep copy

    ResizeNparticles((int)other.GetNparticles());

    max_speed = other.max_speed;
    max_wvel = other.max_wvel;

    sleep_time = other.sleep_time;
    sleep_starttime = other.sleep_starttime;
    sleep_minspeed = other.sleep_minspeed;
    sleep_minwvel = other.sleep_minwvel;
}